

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_det_gen(REF_INT n,REF_DBL *orig,REF_DBL *det)

{
  double dVar1;
  ulong uVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar2 = (ulong)(uint)n;
  __ptr = malloc((ulong)(uint)(n * n) << 3);
  if (__ptr == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x4df,
           "ref_matrix_det_gen","malloc a of REF_DBL NULL");
    return 2;
  }
  if (n < 1) {
    dVar13 = 1.0;
  }
  else {
    uVar3 = 0;
    uVar11 = uVar2;
    do {
      memcpy((void *)((long)__ptr + uVar3 * 8),orig + uVar3,uVar2 * 8);
      uVar3 = (ulong)(uint)((int)uVar3 + n);
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    *det = 1.0;
    if (n < 1) goto LAB_00126d1d;
    dVar13 = 1.0;
    uVar3 = 1;
    lVar4 = 8;
    lVar6 = 0;
    uVar11 = 0;
    do {
      uVar8 = (ulong)(uint)((int)uVar11 * n);
      dVar13 = dVar13 * *(double *)((long)__ptr + uVar8 * 8 + uVar11 * 8);
      uVar7 = uVar11 + 1;
      if (uVar7 < uVar2) {
        lVar9 = lVar4;
        uVar12 = uVar3;
        do {
          dVar1 = *(double *)((long)__ptr + uVar8 * 8 + uVar11 * 8);
          dVar15 = dVar1 * 1e+20;
          if (dVar15 <= -dVar15) {
            dVar15 = -dVar15;
          }
          dVar16 = *(double *)((long)__ptr + uVar12 * 8 + uVar11 * uVar2 * 8);
          dVar14 = -dVar16;
          if (dVar16 <= dVar14) {
            dVar16 = dVar14;
          }
          if (dVar15 <= dVar16) {
            free(__ptr);
            *det = 0.0;
            return 0;
          }
          uVar5 = uVar2;
          pvVar10 = __ptr;
          do {
            *(double *)((long)pvVar10 + lVar9) =
                 *(double *)((long)pvVar10 + lVar6) * (dVar14 / dVar1) +
                 *(double *)((long)pvVar10 + lVar9);
            pvVar10 = (void *)((long)pvVar10 + uVar2 * 8);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 8;
        } while (uVar12 != uVar2);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 8;
      lVar6 = lVar6 + 8;
      uVar11 = uVar7;
    } while (uVar7 != uVar2);
  }
  *det = dVar13;
LAB_00126d1d:
  free(__ptr);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_det_gen(REF_INT n, REF_DBL *orig, REF_DBL *det) {
  REF_DBL *a;
  REF_DBL scale;
  REF_INT i, j, k;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  *det = 1.0;

  for (j = 0; j < n; j++) {
    (*det) *= a[j + n * j];
    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        /* zero pivot */
        ref_free(a);
        *det = 0.0;
        return REF_SUCCESS;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
    }
  }

  ref_free(a);

  return REF_SUCCESS;
}